

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b.h
# Opt level: O1

void __thiscall
FastPForLib::Simple8b<true>::encodeArray
          (Simple8b<true> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  ulong *puVar2;
  long lVar3;
  ulong uVar4;
  char cVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  
  *out = (uint32_t)length;
  puVar2 = (ulong *)(out + 1);
  if (0xef < length) {
    do {
      if (*in == 0) {
        uVar4 = 0;
        do {
          uVar7 = uVar4;
          if (uVar7 == 0x77) break;
          uVar4 = uVar7 + 1;
        } while (in[uVar7 + 1] == 0);
        if (uVar7 < 0x77) goto LAB_0011a6c0;
        if (in[0x78] == 0) {
          uVar4 = 0;
          do {
            uVar7 = uVar4;
            if (uVar7 == 0x77) break;
            uVar4 = uVar7 + 1;
          } while (in[uVar7 + 0x79] == 0);
          if (uVar7 < 0x77) goto LAB_0011a8d8;
          *puVar2 = 0;
          in = in + 0xf0;
          lVar3 = -0xf0;
        }
        else {
LAB_0011a8d8:
          in = in + 0x78;
          *puVar2 = 0x1000000000000000;
          lVar3 = -0x78;
        }
      }
      else {
LAB_0011a6c0:
        if (*in < 2) {
          uVar4 = 0;
          do {
            uVar7 = uVar4;
            if (uVar7 == 0x3b) break;
            uVar4 = uVar7 + 1;
          } while (in[uVar7 + 1] < 2);
          if (0x3a < uVar7) {
            *puVar2 = 2;
            uVar4 = 2;
            lVar3 = 0;
            do {
              uVar4 = uVar4 * 2 | (ulong)in[lVar3];
              lVar3 = lVar3 + 1;
            } while ((int)lVar3 != 0x3c);
            in = in + 0x3c;
            *puVar2 = uVar4;
            lVar3 = -0x3c;
            goto LAB_0011a8e9;
          }
        }
        if (*in < 4) {
          uVar4 = 0;
          do {
            uVar7 = uVar4;
            if (uVar7 == 0x1d) break;
            uVar4 = uVar7 + 1;
          } while (in[uVar7 + 1] < 4);
          if (0x1c < uVar7) {
            *puVar2 = 3;
            uVar4 = 3;
            lVar3 = 0;
            do {
              uVar4 = uVar4 << 2 | (ulong)in[lVar3];
              lVar3 = lVar3 + 1;
            } while ((int)lVar3 != 0x1e);
            in = in + 0x1e;
            *puVar2 = uVar4;
            lVar3 = -0x1e;
            goto LAB_0011a8e9;
          }
        }
        if (*in < 8) {
          uVar4 = 0;
          do {
            uVar7 = uVar4;
            if (uVar7 == 0x13) break;
            uVar4 = uVar7 + 1;
          } while (in[uVar7 + 1] < 8);
          if (0x12 < uVar7) {
            *puVar2 = 4;
            uVar4 = 4;
            lVar3 = 0;
            do {
              uVar4 = uVar4 << 3 | (ulong)in[lVar3];
              lVar3 = lVar3 + 1;
            } while ((int)lVar3 != 0x14);
            in = in + 0x14;
            *puVar2 = uVar4;
            lVar3 = -0x14;
            goto LAB_0011a8e9;
          }
        }
        if (*in < 0x10) {
          uVar4 = 0;
          do {
            uVar7 = uVar4;
            if (uVar7 == 0xe) break;
            uVar4 = uVar7 + 1;
          } while (in[uVar7 + 1] < 0x10);
          if (0xd < uVar7) {
            *puVar2 = 5;
            uVar4 = 5;
            lVar3 = 0;
            do {
              uVar4 = uVar4 << 4 | (ulong)in[lVar3];
              lVar3 = lVar3 + 1;
            } while ((int)lVar3 != 0xf);
            in = in + 0xf;
            *puVar2 = uVar4;
            lVar3 = -0xf;
            goto LAB_0011a8e9;
          }
        }
        if (*in < 0x20) {
          uVar4 = 0;
          do {
            uVar7 = uVar4;
            if (uVar7 == 0xb) break;
            uVar4 = uVar7 + 1;
          } while (in[uVar7 + 1] < 0x20);
          if (10 < uVar7) {
            *puVar2 = 6;
            uVar4 = 6;
            lVar3 = 0;
            do {
              uVar4 = uVar4 << 5 | (ulong)in[lVar3];
              lVar3 = lVar3 + 1;
            } while ((int)lVar3 != 0xc);
            in = in + 0xc;
            *puVar2 = uVar4;
            lVar3 = -0xc;
            goto LAB_0011a8e9;
          }
        }
        if (*in < 0x40) {
          uVar4 = 0;
          do {
            uVar7 = uVar4;
            if (uVar7 == 9) break;
            uVar4 = uVar7 + 1;
          } while (in[uVar7 + 1] < 0x40);
          if (8 < uVar7) {
            *puVar2 = 7;
            uVar4 = 7;
            lVar3 = 0;
            do {
              uVar4 = uVar4 << 6 | (ulong)in[lVar3];
              lVar3 = lVar3 + 1;
            } while ((int)lVar3 != 10);
            in = in + 10;
            *puVar2 = uVar4;
            lVar3 = -10;
            goto LAB_0011a8e9;
          }
        }
        if (*in < 0x80) {
          uVar4 = 0;
          do {
            uVar7 = uVar4;
            if (uVar7 == 7) break;
            uVar4 = uVar7 + 1;
          } while (in[uVar7 + 1] < 0x80);
          if (6 < uVar7) {
            *puVar2 = 8;
            uVar4 = 8;
            lVar3 = 0;
            do {
              uVar4 = uVar4 << 7 | (ulong)in[lVar3];
              lVar3 = lVar3 + 1;
            } while ((int)lVar3 != 8);
            in = in + 8;
            *puVar2 = uVar4 << 4;
            lVar3 = -8;
            goto LAB_0011a8e9;
          }
        }
        if (*in < 0x100) {
          uVar4 = 0;
          do {
            uVar7 = uVar4;
            if (uVar7 == 6) break;
            uVar4 = uVar7 + 1;
          } while (in[uVar7 + 1] < 0x100);
          if (5 < uVar7) {
            *puVar2 = 9;
            uVar4 = 9;
            lVar3 = 0;
            do {
              uVar4 = uVar4 << 8 | (ulong)in[lVar3];
              lVar3 = lVar3 + 1;
            } while ((int)lVar3 != 7);
            in = in + 7;
            *puVar2 = uVar4 << 4;
            lVar3 = -7;
            goto LAB_0011a8e9;
          }
        }
        if (*in < 0x400) {
          uVar4 = 0;
          do {
            uVar7 = uVar4;
            if (uVar7 == 5) break;
            uVar4 = uVar7 + 1;
          } while (in[uVar7 + 1] < 0x400);
          if (4 < uVar7) {
            *puVar2 = 10;
            uVar4 = 10;
            lVar3 = 0;
            do {
              uVar4 = uVar4 << 10 | (ulong)in[lVar3];
              lVar3 = lVar3 + 1;
            } while ((int)lVar3 != 6);
            in = in + 6;
            *puVar2 = uVar4;
            lVar3 = -6;
            goto LAB_0011a8e9;
          }
        }
        if (*in < 0x1000) {
          uVar4 = 0;
          do {
            uVar7 = uVar4;
            if (uVar7 == 4) break;
            uVar4 = uVar7 + 1;
          } while (in[uVar7 + 1] < 0x1000);
          if (3 < uVar7) {
            *puVar2 = 0xb;
            uVar4 = 0xb;
            lVar3 = 0;
            do {
              uVar4 = uVar4 << 0xc | (ulong)in[lVar3];
              lVar3 = lVar3 + 1;
            } while ((int)lVar3 != 5);
            in = in + 5;
            *puVar2 = uVar4;
            lVar3 = -5;
            goto LAB_0011a8e9;
          }
        }
        if (*in < 0x8000) {
          uVar4 = 0;
          do {
            uVar7 = uVar4;
            if (uVar7 == 3) break;
            uVar4 = uVar7 + 1;
          } while (in[uVar7 + 1] < 0x8000);
          if (2 < uVar7) {
            *puVar2 = 0xc;
            uVar4 = 0xc;
            lVar3 = 0;
            do {
              uVar4 = uVar4 << 0xf | (ulong)in[lVar3];
              lVar3 = lVar3 + 1;
            } while ((int)lVar3 != 4);
            in = in + 4;
            *puVar2 = uVar4;
            lVar3 = -4;
            goto LAB_0011a8e9;
          }
        }
        if (*in < 0x100000) {
          uVar4 = 0;
          do {
            uVar7 = uVar4;
            if (uVar7 == 2) break;
            uVar4 = uVar7 + 1;
          } while (in[uVar7 + 1] < 0x100000);
          if (1 < uVar7) {
            *puVar2 = 0xd;
            uVar4 = 0xd;
            lVar3 = 0;
            do {
              uVar4 = uVar4 << 0x14 | (ulong)in[lVar3];
              lVar3 = lVar3 + 1;
            } while ((int)lVar3 != 3);
            in = in + 3;
            *puVar2 = uVar4;
            lVar3 = -3;
            goto LAB_0011a8e9;
          }
        }
        if (*in < 0x40000000) {
          bVar10 = true;
          do {
            bVar11 = bVar10;
            if (!bVar11) goto LAB_0011ab83;
            bVar10 = false;
          } while (in[1] < 0x40000000);
          if (!bVar11) {
LAB_0011ab83:
            *puVar2 = 0xe;
            uVar4 = 0xe;
            lVar3 = 0;
            do {
              uVar4 = uVar4 << 0x1e | (ulong)in[lVar3];
              lVar3 = lVar3 + 1;
            } while ((int)lVar3 == 1);
            in = in + 2;
            *puVar2 = uVar4;
            lVar3 = -2;
            goto LAB_0011a8e9;
          }
        }
        uVar8 = *in;
        in = in + 1;
        *puVar2 = (ulong)uVar8 | 0xf000000000000000;
        lVar3 = -1;
      }
LAB_0011a8e9:
      length = length + lVar3;
      puVar2 = puVar2 + 1;
    } while (0xef < length);
  }
  do {
    if (length == 0) {
      *nvalue = (long)puVar2 - (long)out >> 2;
      return;
    }
    uVar6 = (uint)length;
    uVar8 = 0xf0;
    if (uVar6 < 0xf0) {
      uVar8 = uVar6;
    }
    bVar11 = uVar6 == 0;
    bVar10 = bVar11;
    if (bVar11) {
LAB_0011ac1b:
      if (!bVar10) goto LAB_0011ac36;
      uVar4 = 0xf0;
      if (length < 0xf0) {
        uVar4 = length;
      }
      *puVar2 = 0;
LAB_0011ac8f:
      uVar8 = (uint)uVar4;
      in = in + (uVar4 & 0xffffffff);
    }
    else {
      if (*in == 0) {
        uVar4 = 1;
        do {
          uVar7 = uVar4;
          if (uVar8 + (uVar8 == 0) == uVar7) break;
          uVar4 = uVar7 + 1;
        } while (in[uVar7] == 0);
        bVar10 = uVar8 <= uVar7;
        goto LAB_0011ac1b;
      }
LAB_0011ac36:
      uVar8 = 0x78;
      if (uVar6 < 0x78) {
        uVar8 = uVar6;
      }
      bVar10 = bVar11;
      if (uVar6 == 0) {
LAB_0011ac79:
        if (bVar10) {
          uVar4 = 0x78;
          if (length < 0x78) {
            uVar4 = length;
          }
          *puVar2 = 0x1000000000000000;
          goto LAB_0011ac8f;
        }
      }
      else if (*in == 0) {
        uVar4 = 1;
        do {
          uVar7 = uVar4;
          if (uVar8 + (uVar8 == 0) == uVar7) break;
          uVar4 = uVar7 + 1;
        } while (in[uVar7] == 0);
        bVar10 = uVar8 <= uVar7;
        goto LAB_0011ac79;
      }
      uVar8 = 0x3c;
      if (uVar6 < 0x3c) {
        uVar8 = uVar6;
      }
      bVar10 = bVar11;
      if (uVar6 == 0) {
LAB_0011acde:
        if (!bVar10) goto LAB_0011ad29;
        *puVar2 = 2;
        uVar4 = 0x3c;
        if (length < 0x3c) {
          uVar4 = length;
        }
        uVar8 = (uint)uVar4;
        uVar7 = 1;
        if (1 < uVar8) {
          uVar7 = uVar4 & 0xffffffff;
        }
        uVar9 = 2;
        do {
          uVar6 = *in;
          in = in + 1;
          uVar9 = uVar9 * 2 | (ulong)uVar6;
          uVar6 = (int)uVar7 - 1;
          uVar7 = (ulong)uVar6;
        } while (uVar6 != 0);
        uVar4 = (ulong)(byte)(0x3c - (char)uVar4);
      }
      else {
        if (*in < 2) {
          uVar4 = 1;
          do {
            uVar7 = uVar4;
            if (uVar8 + (uVar8 == 0) == uVar7) break;
            uVar4 = uVar7 + 1;
          } while (in[uVar7] < 2);
          bVar10 = uVar8 <= uVar7;
          goto LAB_0011acde;
        }
LAB_0011ad29:
        uVar8 = 0x1e;
        if (uVar6 < 0x1e) {
          uVar8 = uVar6;
        }
        bVar10 = bVar11;
        if (uVar6 == 0) {
LAB_0011ad6c:
          if (!bVar10) goto LAB_0011adb8;
          *puVar2 = 3;
          uVar4 = 0x1e;
          if (length < 0x1e) {
            uVar4 = length;
          }
          uVar8 = (uint)uVar4;
          uVar7 = 1;
          if (1 < uVar8) {
            uVar7 = uVar4 & 0xffffffff;
          }
          uVar9 = 3;
          do {
            uVar6 = *in;
            in = in + 1;
            uVar9 = uVar9 << 2 | (ulong)uVar6;
            uVar6 = (int)uVar7 - 1;
            uVar7 = (ulong)uVar6;
          } while (uVar6 != 0);
          cVar5 = (char)uVar4 * '\x02';
LAB_0011aecf:
          uVar4 = (ulong)(byte)(0x3c - cVar5);
        }
        else {
          if (*in < 4) {
            uVar4 = 1;
            do {
              uVar7 = uVar4;
              if (uVar8 + (uVar8 == 0) == uVar7) break;
              uVar4 = uVar7 + 1;
            } while (in[uVar7] < 4);
            bVar10 = uVar8 <= uVar7;
            goto LAB_0011ad6c;
          }
LAB_0011adb8:
          uVar8 = 0x14;
          if (uVar6 < 0x14) {
            uVar8 = uVar6;
          }
          bVar10 = bVar11;
          if (uVar6 != 0) {
            if (*in < 8) {
              uVar4 = 1;
              do {
                uVar7 = uVar4;
                if (uVar8 + (uVar8 == 0) == uVar7) break;
                uVar4 = uVar7 + 1;
              } while (in[uVar7] < 8);
              bVar10 = uVar8 <= uVar7;
              goto LAB_0011adfb;
            }
LAB_0011ae45:
            uVar8 = 0xf;
            if (uVar6 < 0xf) {
              uVar8 = uVar6;
            }
            bVar10 = bVar11;
            if (uVar6 == 0) {
LAB_0011ae88:
              if (bVar10) {
                *puVar2 = 5;
                uVar4 = 0xf;
                if (length < 0xf) {
                  uVar4 = length;
                }
                uVar8 = (uint)uVar4;
                uVar7 = 1;
                if (1 < uVar8) {
                  uVar7 = uVar4 & 0xffffffff;
                }
                uVar9 = 5;
                do {
                  uVar6 = *in;
                  in = in + 1;
                  uVar9 = uVar9 << 4 | (ulong)uVar6;
                  uVar6 = (int)uVar7 - 1;
                  uVar7 = (ulong)uVar6;
                } while (uVar6 != 0);
                cVar5 = (char)(uVar8 << 2);
                goto LAB_0011aecf;
              }
            }
            else if (*in < 0x10) {
              uVar4 = 1;
              do {
                uVar7 = uVar4;
                if (uVar8 + (uVar8 == 0) == uVar7) break;
                uVar4 = uVar7 + 1;
              } while (in[uVar7] < 0x10);
              bVar10 = uVar8 <= uVar7;
              goto LAB_0011ae88;
            }
            uVar8 = 0xc;
            if (uVar6 < 0xc) {
              uVar8 = uVar6;
            }
            bVar10 = bVar11;
            if (uVar6 == 0) {
LAB_0011af1d:
              if (bVar10) {
                *puVar2 = 6;
                uVar4 = 0xc;
                if (length < 0xc) {
                  uVar4 = length;
                }
                uVar8 = (uint)uVar4;
                uVar7 = 1;
                if (1 < uVar8) {
                  uVar7 = uVar4 & 0xffffffff;
                }
                uVar9 = 6;
                do {
                  uVar6 = *in;
                  in = in + 1;
                  uVar9 = uVar9 << 5 | (ulong)uVar6;
                  uVar6 = (int)uVar7 - 1;
                  uVar7 = (ulong)uVar6;
                } while (uVar6 != 0);
                cVar5 = -5;
                goto LAB_0011b07e;
              }
            }
            else if (*in < 0x20) {
              uVar4 = 1;
              do {
                uVar7 = uVar4;
                if (uVar8 + (uVar8 == 0) == uVar7) break;
                uVar4 = uVar7 + 1;
              } while (in[uVar7] < 0x20);
              bVar10 = uVar8 <= uVar7;
              goto LAB_0011af1d;
            }
            uVar8 = 10;
            if (uVar6 < 10) {
              uVar8 = uVar6;
            }
            bVar10 = bVar11;
            if (uVar6 == 0) {
LAB_0011afaa:
              if (!bVar10) goto LAB_0011aff4;
              *puVar2 = 7;
              uVar4 = 10;
              if (length < 10) {
                uVar4 = length;
              }
              uVar8 = (uint)uVar4;
              uVar7 = 1;
              if (1 < uVar8) {
                uVar7 = uVar4 & 0xffffffff;
              }
              uVar9 = 7;
              do {
                uVar6 = *in;
                in = in + 1;
                uVar9 = uVar9 << 6 | (ulong)uVar6;
                uVar6 = (int)uVar7 - 1;
                uVar7 = (ulong)uVar6;
              } while (uVar6 != 0);
              cVar5 = -6;
LAB_0011b1cd:
              uVar4 = (ulong)(byte)((char)uVar8 * cVar5 + 0x3c);
              goto LAB_0011b089;
            }
            if (*in < 0x40) {
              uVar4 = 1;
              do {
                uVar7 = uVar4;
                if (uVar8 + (uVar8 == 0) == uVar7) break;
                uVar4 = uVar7 + 1;
              } while (in[uVar7] < 0x40);
              bVar10 = uVar8 <= uVar7;
              goto LAB_0011afaa;
            }
LAB_0011aff4:
            uVar8 = 8;
            if (uVar6 < 8) {
              uVar8 = uVar6;
            }
            bVar10 = bVar11;
            if (uVar6 == 0) {
LAB_0011b03e:
              if (bVar10) {
                uVar9 = 8;
                *puVar2 = 8;
                uVar4 = 8;
                if (length < 8) {
                  uVar4 = length;
                }
                uVar8 = (uint)uVar4;
                uVar7 = 1;
                if (1 < uVar8) {
                  uVar7 = uVar4 & 0xffffffff;
                }
                do {
                  uVar6 = *in;
                  in = in + 1;
                  uVar9 = uVar9 << 7 | (ulong)uVar6;
                  uVar6 = (int)uVar7 - 1;
                  uVar7 = (ulong)uVar6;
                } while (uVar6 != 0);
                cVar5 = -7;
                goto LAB_0011b07e;
              }
            }
            else if (*in < 0x80) {
              uVar4 = 1;
              do {
                uVar7 = uVar4;
                if (uVar8 + (uVar8 == 0) == uVar7) break;
                uVar4 = uVar7 + 1;
              } while (in[uVar7] < 0x80);
              bVar10 = uVar8 <= uVar7;
              goto LAB_0011b03e;
            }
            uVar8 = 7;
            if (uVar6 < 7) {
              uVar8 = uVar6;
            }
            bVar10 = bVar11;
            if (uVar6 == 0) {
LAB_0011b0ef:
              if (bVar10) {
                *puVar2 = 9;
                uVar4 = 7;
                if (length < 7) {
                  uVar4 = length;
                }
                uVar8 = (uint)uVar4;
                uVar7 = 1;
                if (1 < uVar8) {
                  uVar7 = uVar4 & 0xffffffff;
                }
                uVar9 = 9;
                do {
                  uVar6 = *in;
                  in = in + 1;
                  uVar9 = uVar9 << 8 | (ulong)uVar6;
                  uVar6 = (int)uVar7 - 1;
                  uVar7 = (ulong)uVar6;
                } while (uVar6 != 0);
                cVar5 = (char)(uVar8 << 3);
                goto LAB_0011aecf;
              }
            }
            else if (*in < 0x100) {
              uVar4 = 1;
              do {
                uVar7 = uVar4;
                if (uVar8 + (uVar8 == 0) == uVar7) break;
                uVar4 = uVar7 + 1;
              } while (in[uVar7] < 0x100);
              bVar10 = uVar8 <= uVar7;
              goto LAB_0011b0ef;
            }
            uVar8 = 6;
            if (uVar6 < 6) {
              uVar8 = uVar6;
            }
            bVar10 = bVar11;
            if (uVar6 == 0) {
LAB_0011b188:
              if (bVar10) {
                *puVar2 = 10;
                uVar4 = 6;
                if (length < 6) {
                  uVar4 = length;
                }
                uVar8 = (uint)uVar4;
                uVar7 = 1;
                if (1 < uVar8) {
                  uVar7 = uVar4 & 0xffffffff;
                }
                uVar9 = 10;
                do {
                  uVar6 = *in;
                  in = in + 1;
                  uVar9 = uVar9 << 10 | (ulong)uVar6;
                  uVar6 = (int)uVar7 - 1;
                  uVar7 = (ulong)uVar6;
                } while (uVar6 != 0);
                cVar5 = -10;
                goto LAB_0011b1cd;
              }
            }
            else if (*in < 0x400) {
              uVar4 = 1;
              do {
                uVar7 = uVar4;
                if (uVar8 + (uVar8 == 0) == uVar7) break;
                uVar4 = uVar7 + 1;
              } while (in[uVar7] < 0x400);
              bVar10 = uVar8 <= uVar7;
              goto LAB_0011b188;
            }
            uVar8 = 5;
            if (uVar6 < 5) {
              uVar8 = uVar6;
            }
            bVar10 = bVar11;
            if (uVar6 == 0) {
LAB_0011b22a:
              if (!bVar10) goto LAB_0011b27b;
              *puVar2 = 0xb;
              uVar4 = 5;
              if (length < 5) {
                uVar4 = length;
              }
              uVar8 = (uint)uVar4;
              uVar7 = 1;
              if (1 < uVar8) {
                uVar7 = uVar4 & 0xffffffff;
              }
              uVar9 = 0xb;
              do {
                uVar6 = *in;
                in = in + 1;
                uVar9 = uVar9 << 0xc | (ulong)uVar6;
                uVar6 = (int)uVar7 - 1;
                uVar7 = (ulong)uVar6;
              } while (uVar6 != 0);
              cVar5 = (char)uVar4 * -0xc;
LAB_0011b3a3:
              uVar4 = (ulong)(byte)(cVar5 + 0x3c);
              goto LAB_0011b089;
            }
            if (*in < 0x1000) {
              uVar4 = 1;
              do {
                uVar7 = uVar4;
                if (uVar8 + (uVar8 == 0) == uVar7) break;
                uVar4 = uVar7 + 1;
              } while (in[uVar7] < 0x1000);
              bVar10 = uVar8 <= uVar7;
              goto LAB_0011b22a;
            }
LAB_0011b27b:
            uVar8 = 4;
            if (uVar6 < 4) {
              uVar8 = uVar6;
            }
            bVar10 = bVar11;
            if (uVar6 == 0) {
LAB_0011b2c4:
              if (bVar10) {
                *puVar2 = 0xc;
                uVar4 = 4;
                if (length < 4) {
                  uVar4 = length;
                }
                uVar8 = (uint)uVar4;
                uVar7 = 1;
                if (1 < uVar8) {
                  uVar7 = uVar4 & 0xffffffff;
                }
                uVar9 = 0xc;
                do {
                  uVar6 = *in;
                  in = in + 1;
                  uVar9 = uVar9 << 0xf | (ulong)uVar6;
                  uVar6 = (int)uVar7 - 1;
                  uVar7 = (ulong)uVar6;
                } while (uVar6 != 0);
                cVar5 = -0xf;
                goto LAB_0011b07e;
              }
            }
            else if (*in < 0x8000) {
              uVar4 = 1;
              do {
                uVar7 = uVar4;
                if (uVar8 + (uVar8 == 0) == uVar7) break;
                uVar4 = uVar7 + 1;
              } while (in[uVar7] < 0x8000);
              bVar10 = uVar8 <= uVar7;
              goto LAB_0011b2c4;
            }
            uVar8 = 3;
            if (uVar6 < 3) {
              uVar8 = uVar6;
            }
            bVar10 = bVar11;
            if (uVar6 == 0) {
LAB_0011b35b:
              if (bVar10) {
                *puVar2 = 0xd;
                uVar4 = 3;
                if (length < 3) {
                  uVar4 = length;
                }
                uVar8 = (uint)uVar4;
                uVar7 = 1;
                if (1 < uVar8) {
                  uVar7 = uVar4 & 0xffffffff;
                }
                uVar9 = 0xd;
                do {
                  uVar6 = *in;
                  in = in + 1;
                  uVar9 = uVar9 << 0x14 | (ulong)uVar6;
                  uVar6 = (int)uVar7 - 1;
                  uVar7 = (ulong)uVar6;
                } while (uVar6 != 0);
                cVar5 = (char)uVar4 * -0x14;
                goto LAB_0011b3a3;
              }
            }
            else if (*in < 0x100000) {
              uVar4 = 1;
              do {
                uVar7 = uVar4;
                if (uVar8 + (uVar8 == 0) == uVar7) break;
                uVar4 = uVar7 + 1;
              } while (in[uVar7] < 0x100000);
              bVar10 = uVar8 <= uVar7;
              goto LAB_0011b35b;
            }
            uVar8 = 2;
            if (uVar6 < 2) {
              uVar8 = uVar6;
            }
            if (uVar6 == 0) {
LAB_0011b3f8:
              if (bVar11) {
                *puVar2 = 0xe;
                uVar8 = (length != 1) + 1;
                uVar9 = 0xe;
                uVar6 = uVar8;
                do {
                  uVar1 = *in;
                  in = in + 1;
                  uVar9 = uVar9 << 0x1e | (ulong)uVar1;
                  uVar6 = uVar6 - 1;
                } while (uVar6 != 0);
                cVar5 = (char)(-0x1e << (length != 1));
                goto LAB_0011b085;
              }
            }
            else if (*in < 0x40000000) {
              uVar4 = 1;
              do {
                uVar7 = uVar4;
                if (uVar8 + (uVar8 == 0) == uVar7) break;
                uVar4 = uVar7 + 1;
              } while (in[uVar7] < 0x40000000);
              bVar11 = uVar8 <= uVar7;
              goto LAB_0011b3f8;
            }
            uVar8 = *in;
            in = in + 1;
            *puVar2 = (ulong)uVar8 | 0xf000000000000000;
            uVar8 = 1;
            goto LAB_0011b091;
          }
LAB_0011adfb:
          if (!bVar10) goto LAB_0011ae45;
          *puVar2 = 4;
          uVar4 = 0x14;
          if (length < 0x14) {
            uVar4 = length;
          }
          uVar8 = (uint)uVar4;
          uVar7 = 1;
          if (1 < uVar8) {
            uVar7 = uVar4 & 0xffffffff;
          }
          uVar9 = 4;
          do {
            uVar6 = *in;
            in = in + 1;
            uVar9 = uVar9 << 3 | (ulong)uVar6;
            uVar6 = (int)uVar7 - 1;
            uVar7 = (ulong)uVar6;
          } while (uVar6 != 0);
          cVar5 = -3;
LAB_0011b07e:
          cVar5 = (char)uVar8 * cVar5;
LAB_0011b085:
          uVar4 = (ulong)(byte)(cVar5 + 0x3c);
        }
      }
LAB_0011b089:
      *puVar2 = uVar9 << (uVar4 & 0x3f);
    }
LAB_0011b091:
    puVar2 = puVar2 + 1;
    length = length - uVar8;
  } while( true );
}

Assistant:

void Simple8b<MarkLength>::encodeArray(const uint32_t *in, const size_t length,
                                       uint32_t *out, size_t &nvalue) {
#ifndef NDEBUG
  const uint32_t *const initin(in);
#endif
  uint32_t NumberOfValuesCoded = 0;
  const uint32_t *const initout(out);
  if (MarkLength) {
    *out = static_cast<uint32_t>(length);
    ++out;
  }
  // this may lead to unaligned access. Performance may be affected.
  // not much of an effect in practice on recent Intel processors.
  uint64_t *out64 = reinterpret_cast<uint64_t *>(out);
  size_t ValuesRemaining(length);
  // precompute
  const bool becareful(false);
  while (ValuesRemaining >= 240) {
    if (trymefull<120, 0>(in)) {
      if (trymefull<120, 0>(in + 120)) {
        NumberOfValuesCoded = 240;
        out64[0] = 0;
        in += NumberOfValuesCoded;
        if (becareful)
          assert(which(out64) == 0);

      } else {
        NumberOfValuesCoded = 120;
        out64[0] = 1ULL << (64 - SIMPLE8B_LOGDESC);
        in += NumberOfValuesCoded;
        if (becareful)
          assert(which(out64) == 1);
      }
    } else if (trymefull<60, 1>(in)) {
      out64[0] = 2;
      NumberOfValuesCoded = 60;
      for (uint32_t i = 0; i < 60; i++) {
        bit_writer(out64, *in++, 1);
      }
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 1 * 60;
      if (becareful)
        assert(which(out64) == 2);
    } else if (trymefull<30, 2>(in)) {
      out64[0] = 3;
      NumberOfValuesCoded = 30;
      for (uint32_t i = 0; i < 30; i++)
        bit_writer(out64, *in++, 2);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 2 * 30;
      if (becareful)
        assert(which(out64) == 3);
    } else if (trymefull<20, 3>(in)) {
      out64[0] = 4;
      NumberOfValuesCoded = 20;
      for (uint32_t i = 0; i < 20; i++)
        bit_writer(out64, *in++, 3);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 3 * 20;
      if (becareful)
        assert(which(out64) == 4);
    } else if (trymefull<15, 4>(in)) {
      out64[0] = 5;
      NumberOfValuesCoded = 15;
      for (uint32_t i = 0; i < 15; i++)
        bit_writer(out64, *in++, 4);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 4 * 15;
      if (becareful)
        assert(which(out64) == 5);
    } else if (trymefull<12, 5>(in)) {
      out64[0] = 6;
      NumberOfValuesCoded = 12;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 5);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 5 * 12;
      if (becareful)
        assert(which(out64) == 6);
    } else if (trymefull<10, 6>(in)) {
      out64[0] = 7;
      NumberOfValuesCoded = 10;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 6);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 6 * 10;
      if (becareful)
        assert(which(out64) == 7);
    } else if (trymefull<8, 7>(in)) {
      out64[0] = 8;
      NumberOfValuesCoded = 8;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 7);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 7 * 8;
      if (becareful)
        assert(which(out64) == 8);
    } else if (trymefull<7, 8>(in)) {
      out64[0] = 9;
      NumberOfValuesCoded = 7;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 8);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 8 * 7;
      if (becareful)
        assert(which(out64) == 9);
    } else if (trymefull<6, 10>(in)) {
      out64[0] = 10;
      NumberOfValuesCoded = 6;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 10);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 10 * 6;
      if (becareful)
        assert(which(out64) == 10);
    } else if (trymefull<5, 12>(in)) {
      out64[0] = 11;
      NumberOfValuesCoded =
          (ValuesRemaining < 5) ? static_cast<uint32_t>(ValuesRemaining) : 5;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 12);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 12 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 11);
    } else if (trymefull<4, 15>(in)) {
      out64[0] = 12;
      NumberOfValuesCoded = 4;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 15);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 15 * 4;
      if (becareful)
        assert(which(out64) == 12);
    } else if (trymefull<3, 20>(in)) {
      out64[0] = 13;
      NumberOfValuesCoded = 3;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 20);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 20 * 3;
      if (becareful)
        assert(which(out64) == 13);
    } else if (trymefull<2, 30>(in)) {
      out64[0] = 14;
      NumberOfValuesCoded = 2;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 30);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 30 * 2;
      if (becareful)
        assert(which(out64) == 14);
    } else if (trymefull<1, 60>(in)) {
      out64[0] = 15;
      NumberOfValuesCoded = 1;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 60);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 60 * 1;
      if (becareful)
        assert(which(out64) == 15);
    } else {
      throw std::logic_error("shouldn't happen");
    }
    ++out64;

    ValuesRemaining -= NumberOfValuesCoded;
  }

  while (ValuesRemaining > 0) {
    if (tryme<240, 0>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 240)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 240;
      out64[0] = 0;
      in += NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 0);
    } else if (tryme<120, 0>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 120)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 120;
      out64[0] = 1ULL << (64 - SIMPLE8B_LOGDESC);
      in += NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 1);
    } else if (tryme<60, 1>(in, ValuesRemaining)) {
      out64[0] = 2;
      NumberOfValuesCoded =
          (ValuesRemaining < 60) ? static_cast<uint32_t>(ValuesRemaining) : 60;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++) {
        bit_writer(out64, *in++, 1);
      }
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 1 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 2);
    } else if (tryme<30, 2>(in, ValuesRemaining)) {
      out64[0] = 3;
      NumberOfValuesCoded =
          (ValuesRemaining < 30) ? static_cast<uint32_t>(ValuesRemaining) : 30;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 2);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 2 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 3);
    } else if (tryme<20, 3>(in, ValuesRemaining)) {
      out64[0] = 4;
      NumberOfValuesCoded =
          (ValuesRemaining < 20) ? static_cast<uint32_t>(ValuesRemaining) : 20;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 3);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 3 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 4);
    } else if (tryme<15, 4>(in, ValuesRemaining)) {
      out64[0] = 5;
      NumberOfValuesCoded =
          (ValuesRemaining < 15) ? static_cast<uint32_t>(ValuesRemaining) : 15;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 4);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 4 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 5);
    } else if (tryme<12, 5>(in, ValuesRemaining)) {
      out64[0] = 6;
      NumberOfValuesCoded =
          (ValuesRemaining < 12) ? static_cast<uint32_t>(ValuesRemaining) : 12;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 5);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 5 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 6);
    } else if (tryme<10, 6>(in, ValuesRemaining)) {
      out64[0] = 7;
      NumberOfValuesCoded =
          (ValuesRemaining < 10) ? static_cast<uint32_t>(ValuesRemaining) : 10;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 6);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 6 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 7);
    } else if (tryme<8, 7>(in, ValuesRemaining)) {
      out64[0] = 8;
      NumberOfValuesCoded =
          (ValuesRemaining < 8) ? static_cast<uint32_t>(ValuesRemaining) : 8;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 7);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 7 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 8);
    } else if (tryme<7, 8>(in, ValuesRemaining)) {
      out64[0] = 9;
      NumberOfValuesCoded =
          (ValuesRemaining < 7) ? static_cast<uint32_t>(ValuesRemaining) : 7;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 8);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 8 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 9);
    } else if (tryme<6, 10>(in, ValuesRemaining)) {
      out64[0] = 10;
      NumberOfValuesCoded =
          (ValuesRemaining < 6) ? static_cast<uint32_t>(ValuesRemaining) : 6;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 10);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 10 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 10);
    } else if (tryme<5, 12>(in, ValuesRemaining)) {
      out64[0] = 11;
      NumberOfValuesCoded =
          (ValuesRemaining < 5) ? static_cast<uint32_t>(ValuesRemaining) : 5;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 12);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 12 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 11);
    } else if (tryme<4, 15>(in, ValuesRemaining)) {
      out64[0] = 12;
      NumberOfValuesCoded =
          (ValuesRemaining < 4) ? static_cast<uint32_t>(ValuesRemaining) : 4;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 15);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 15 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 12);
    } else if (tryme<3, 20>(in, ValuesRemaining)) {
      out64[0] = 13;
      NumberOfValuesCoded =
          (ValuesRemaining < 3) ? static_cast<uint32_t>(ValuesRemaining) : 3;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 20);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 20 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 13);
    } else if (tryme<2, 30>(in, ValuesRemaining)) {
      out64[0] = 14;
      NumberOfValuesCoded =
          (ValuesRemaining < 2) ? static_cast<uint32_t>(ValuesRemaining) : 2;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 30);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 30 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 14);
    } else if (tryme<1, 60>(in, ValuesRemaining)) {
      out64[0] = 15;
      NumberOfValuesCoded = (ValuesRemaining < 1) ? uint32_t(ValuesRemaining) : 1;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 60);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 60 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 15);
    } else {
      throw std::logic_error("shouldn't happen");
    }
    if (becareful)
      ASSERT(initin + length - ValuesRemaining + NumberOfValuesCoded == in,
          std::to_string(which(out64)));
    ++out64;

    ValuesRemaining -= NumberOfValuesCoded;
  }
  assert(initin + length == in);
  nvalue = reinterpret_cast<uint32_t *>(out64) - initout;
}